

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  long lVar1;
  oggpack_buffer *poVar2;
  long lVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lStack_50;
  oggpack_buffer *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = b;
  uVar9 = 0;
  if (0 < book->used_entries) {
    lVar7 = book->dim;
    local_40 = (long)n / lVar7;
    lVar5 = -((long)(int)local_40 * 8 + 0xfU & 0xfffffffffffffff0);
    lVar1 = lVar5 + -0x48;
    if (0 < (int)local_40) {
      uVar9 = local_40 & 0xffffffff;
    }
    iVar6 = point - book->binarypoint;
    bVar4 = (byte)iVar6;
    if (iVar6 < 0) {
      for (local_38 = 0; poVar2 = local_48, uVar9 != local_38; local_38 = local_38 + 1) {
        *(undefined8 *)((long)&lStack_50 + lVar5) = 0x11eb85;
        lVar3 = decode_packed_entry_number(book,poVar2);
        if (lVar3 == -1) goto LAB_0011ebab;
        lVar7 = book->dim;
        *(ogg_int32_t **)((long)&local_48 + local_38 * 8 + lVar1 + 0x48) =
             book->valuelist + lVar3 * lVar7;
      }
      if (lVar7 < 1) {
        lVar7 = 0;
      }
      for (lVar5 = 0; lVar5 != lVar7; lVar5 = lVar5 + 1) {
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          a[uVar8] = a[uVar8] +
                     (*(int *)(*(long *)((long)&local_48 + uVar8 * 8 + lVar1 + 0x48) + lVar5 * 4) <<
                     (-bVar4 & 0x1f));
        }
        a = a + (int)local_40;
      }
    }
    else {
      for (local_38 = 0; poVar2 = local_48, uVar9 != local_38; local_38 = local_38 + 1) {
        *(undefined8 *)((long)&lStack_50 + lVar5) = 0x11eb48;
        lVar3 = decode_packed_entry_number(book,poVar2);
        if (lVar3 == -1) {
LAB_0011ebab:
          *(undefined8 *)((long)&lStack_50 + lVar5) = 0xffffffffffffffff;
          return *(long *)((long)&lStack_50 + lVar5);
        }
        lVar7 = book->dim;
        *(ogg_int32_t **)((long)&local_48 + local_38 * 8 + lVar1 + 0x48) =
             book->valuelist + lVar3 * lVar7;
      }
      if (lVar7 < 1) {
        lVar7 = 0;
      }
      for (lVar5 = 0; lVar5 != lVar7; lVar5 = lVar5 + 1) {
        for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
          a[uVar8] = a[uVar8] +
                     (*(int *)(*(long *)((long)&local_48 + uVar8 * 8 + lVar1 + 0x48) + lVar5 * 4) >>
                     (bVar4 & 0x1f));
        }
        a = a + (int)local_40;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,
			      oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){  
    int step=n/book->dim;
    long *entry = (long *)alloca(sizeof(*entry)*step);
    ogg_int32_t **t = (ogg_int32_t **)alloca(sizeof(*t)*step);
    int i,j,o;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]>>shift;
    }else{
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]<<-shift;
    }
  }
  return(0);
}